

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

bool __thiscall ON_Object::ThisIsNullptr(ON_Object *this,bool bSilentError)

{
  bool bSilentError_local;
  ON_Object *this_local;
  
  if (this == (ON_Object *)0x0) {
    if (!bSilentError) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x709,"","this is nullptr.");
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Object::ThisIsNullptr(
  bool bSilentError
) const
{
  // CLang warns that these tests may be omitted because in "well-defined C++ code"
  // they are always false. 
  //
  // Earth to CLang: 
  //   This tool to find code that is not well formed, alert us to that fact, 
  //   but not potentiall not crash so our loyal customers don't loose their work.
  //
  // return (this == nullptr);
  // return ( nullptr == this );
  if (0 != ((ON__UINT_PTR)this))
    return false;

  if (false == bSilentError)
    ON_ERROR("this is nullptr.");

  return true;
}